

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O3

IOTHUB_AUTHORIZATION_HANDLE
IoTHubClient_Auth_Create(char *device_key,char *device_id,char *device_sas_token,char *module_id)

{
  int iVar1;
  BUFFER_HANDLE handle;
  LOGGER_LOG p_Var2;
  IOTHUB_AUTHORIZATION_DATA *destination;
  char *pcVar3;
  bool bVar4;
  
  if (device_key == (char *)0x0) {
    bVar4 = false;
  }
  else {
    handle = Azure_Base64_Decode(device_key);
    bVar4 = handle == (BUFFER_HANDLE)0x0;
    BUFFER_delete(handle);
  }
  if ((bool)(device_id != (char *)0x0 & (bVar4 ^ 1U))) {
    destination = initialize_auth_client(device_id,module_id);
    if (destination == (IOTHUB_AUTHORIZATION_DATA *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar3 = "Failure initializing auth client";
        iVar1 = 0x7d;
        goto LAB_00128857;
      }
    }
    else {
      if (device_key == (char *)0x0) {
        if (device_sas_token == (char *)0x0) {
          destination->cred_type = IOTHUB_CREDENTIAL_TYPE_UNKNOWN;
          return destination;
        }
        destination->cred_type = IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN;
        iVar1 = mallocAndStrcpy_s(&destination->device_sas_token,device_sas_token);
        if (iVar1 == 0) {
          return destination;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                    ,"IoTHubClient_Auth_Create",0x92,1,"Failed allocating device_key");
        }
        free(destination->device_key);
      }
      else {
        iVar1 = mallocAndStrcpy_s(&destination->device_key,device_key);
        if (iVar1 == 0) {
          destination->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY;
          return destination;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                    ,"IoTHubClient_Auth_Create",0x81,1,"Failed allocating device_key");
        }
      }
      free(destination->device_id);
      free(destination->module_id);
      free(destination);
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = "Invalid Parameter %s";
      iVar1 = 0x75;
LAB_00128857:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_Create",iVar1,1,pcVar3);
      return (IOTHUB_AUTHORIZATION_HANDLE)0x0;
    }
  }
  return (IOTHUB_AUTHORIZATION_HANDLE)0x0;
}

Assistant:

IOTHUB_AUTHORIZATION_HANDLE IoTHubClient_Auth_Create(const char* device_key, const char* device_id, const char* device_sas_token, const char *module_id)
{
    IOTHUB_AUTHORIZATION_DATA* result;
    bool is_key_valid;

    if (device_key == NULL)
    {
        is_key_valid = true;
    }
    else
    {
        BUFFER_HANDLE key = Azure_Base64_Decode(device_key);
        if (key != NULL)
        {
            is_key_valid = true;
        }
        else
        {
            is_key_valid = false;
        }
        BUFFER_delete(key);
    }
    
    if ((device_id == NULL) || (!is_key_valid))
    {
        LogError("Invalid Parameter %s", ((device_id == NULL) ? "device_id: NULL" : "key"));
        result = NULL;
    }
    else
    {
        result = initialize_auth_client(device_id, module_id);
        if (result == NULL)
        {
            LogError("Failure initializing auth client");
        }
        else if (device_key != NULL && mallocAndStrcpy_s(&result->device_key, device_key) != 0)
        {
            LogError("Failed allocating device_key");
            free(result->device_id);
            free(result->module_id);
            free(result);
            result = NULL;
        }
        else
        {
            if (device_key != NULL)
            {
                result->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY;
            }
            else if (device_sas_token != NULL)
            {
                result->cred_type = IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN;
                if (mallocAndStrcpy_s(&result->device_sas_token, device_sas_token) != 0)
                {
                    LogError("Failed allocating device_key");
                    free(result->device_key);
                    free(result->device_id);
                    free(result->module_id);
                    free(result);
                    result = NULL;
                }
            }
            else
            {
                result->cred_type = IOTHUB_CREDENTIAL_TYPE_UNKNOWN;
            }
        }
    }
    return result;
}